

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O0

void __thiscall
cs::function::function
          (function *this,context_t *c,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *body,
          bool is_vargs,bool is_lambda)

{
  byte bVar1;
  function *in_RDI;
  undefined4 in_R8D;
  byte in_R9B;
  undefined4 in_stack_ffffffffffffff98;
  function *this_00;
  
  bVar1 = (byte)in_R8D;
  this_00 = in_RDI;
  std::shared_ptr<cs::context_type>::shared_ptr
            (&in_RDI->mContext,
             (shared_ptr<cs::context_type> *)CONCAT44(in_R8D,in_stack_ffffffffffffff98));
  *(undefined1 *)&((iterator *)&in_RDI->mIsMemFn)->_M_cur = 0;
  in_RDI->mIsVargs = (bool)(bVar1 & 1);
  in_RDI->mIsLambda = (bool)(in_R9B & 1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)this_00,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)CONCAT44(in_R8D,in_stack_ffffffffffffff98));
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)this_00,
             (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
             CONCAT44(in_R8D,in_stack_ffffffffffffff98));
  this_00->call_ptr = (_func_var_function_ptr_vector_ptr *)0x0;
  init_call_ptr(this_00);
  return;
}

Assistant:

function(context_t c, std::vector<std::string> args, std::deque<statement_base *> body, bool is_vargs = false, bool is_lambda = false) :
			mContext(std::move(c)), mIsVargs(is_vargs), mIsLambda(is_lambda), mArgs(std::move(args)), mBody(std::move(body))
		{
			init_call_ptr();
		}